

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_csv.cpp
# Opt level: O2

plus_triple * argagg::convert::arg<plus_triple>(plus_triple *__return_storage_ptr__,char *s)

{
  bool bVar1;
  char *s_local;
  
  __return_storage_ptr__->x = 0.0;
  __return_storage_ptr__->y = 0.0;
  __return_storage_ptr__->z = 0.0;
  s_local = s;
  bVar1 = parse_next_component<double>(&s_local,&__return_storage_ptr__->x,'+');
  if (bVar1) {
    bVar1 = parse_next_component<double>(&s_local,&__return_storage_ptr__->y,'+');
    if (bVar1) {
      parse_next_component<double>(&s_local,&__return_storage_ptr__->z,'+');
    }
  }
  return __return_storage_ptr__;
}

Assistant:

plus_triple arg(const char* s)
  {
    plus_triple result {0.0, 0.0, 0.0};
    if (!parse_next_component(s, result.x, '+')) {
      return result;
    }
    if (!parse_next_component(s, result.y, '+')) {
      return result;
    }
    if (!parse_next_component(s, result.z, '+')) {
      return result;
    }
    return result;
  }